

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseElement(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int line;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  iVar1 = xmlParseElementStart(ctxt);
  if (iVar1 == 0) {
    xmlParseContentInternal(ctxt);
    if (ctxt->input->cur < ctxt->input->end) {
      xmlParseElementEnd(ctxt);
    }
    else if (ctxt->wellFormed != 0) {
      xmlFatalErrMsgStrIntStr
                (ctxt,XML_ERR_TAG_NOT_FINISHED,"Premature end of data in tag %s line %d\n",
                 ctxt->nameTab[ctxt->nameNr + -1],ctxt->pushTab[ctxt->nameNr + -1].line,
                 (xmlChar *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlParseElement(xmlParserCtxtPtr ctxt) {
    if (xmlParseElementStart(ctxt) != 0)
        return;

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur >= ctxt->input->end) {
        if (ctxt->wellFormed) {
            const xmlChar *name = ctxt->nameTab[ctxt->nameNr - 1];
            int line = ctxt->pushTab[ctxt->nameNr - 1].line;
            xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NOT_FINISHED,
                    "Premature end of data in tag %s line %d\n",
                    name, line, NULL);
        }
        return;
    }

    xmlParseElementEnd(ctxt);
}